

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O3

button_state * button_state_create(xcb_connection_t *connection)

{
  byte keycodes_per_modifier;
  long lVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  undefined4 uVar5;
  int iVar6;
  button_state *pbVar7;
  toggle_modifiers *__ptr;
  xcb_key_symbols_t *symbols;
  toggle_modifiers *__ptr_00;
  xcb_keycode_t *modifiers;
  uint16_t *puVar8;
  ushort uVar9;
  ulong uVar10;
  uint8_t modifier_count;
  
  pbVar7 = (button_state *)malloc(0x28);
  if (pbVar7 == (button_state *)0x0) {
    return (button_state *)0x0;
  }
  __ptr = (toggle_modifiers *)malloc(0x10);
  if (__ptr != (toggle_modifiers *)0x0) {
    symbols = (xcb_key_symbols_t *)xcb_key_symbols_alloc(connection);
    if (symbols != (xcb_key_symbols_t *)0x0) {
      uVar5 = xcb_get_modifier_mapping(connection);
      __ptr_00 = (toggle_modifiers *)xcb_get_modifier_mapping_reply(connection,uVar5,0);
      if ((__ptr_00 == (toggle_modifiers *)0x0) ||
         (*(char *)((long)&__ptr_00->num_lock + 1) == '\0')) {
        free(__ptr);
        xcb_key_symbols_free(symbols);
        goto LAB_00104954;
      }
      modifiers = (xcb_keycode_t *)xcb_get_modifier_mapping_keycodes(__ptr_00);
      if (modifiers != (xcb_keycode_t *)0x0) {
        iVar6 = xcb_get_modifier_mapping_keycodes_length(__ptr_00);
        keycodes_per_modifier = *(byte *)((long)&__ptr_00->num_lock + 1);
        lVar1 = (long)iVar6 / (long)(int)(uint)keycodes_per_modifier;
        if (0xff < (uint)lVar1) {
          __assert_fail("modifier_count >= 0 && modifier_count <= UINT8_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/core/button.c"
                        ,0xa6,
                        "struct toggle_modifiers *resolve_toggle_modifiers(xcb_connection_t *)");
        }
        modifier_count = (uint8_t)lVar1;
        uVar2 = modifier_mask_from_keysym
                          (symbols,modifiers,modifier_count,keycodes_per_modifier,0xff7f);
        __ptr->num_lock = uVar2;
        uVar3 = modifier_mask_from_keysym
                          (symbols,modifiers,modifier_count,
                           *(uint8_t *)((long)&__ptr_00->num_lock + 1),0xffe5);
        __ptr->caps_lock = uVar3;
        uVar4 = modifier_mask_from_keysym
                          (symbols,modifiers,modifier_count,
                           *(uint8_t *)((long)&__ptr_00->num_lock + 1),0xff14);
        __ptr->scroll_lock = uVar4;
        if (uVar3 == 0) {
          __ptr->caps_lock = 2;
          uVar3 = 2;
        }
        puVar8 = (uint16_t *)malloc(0x10);
        if (puVar8 != (uint16_t *)0x0) {
          if (uVar2 == 0) {
            uVar10 = 0;
            if (uVar4 != 0) {
              uVar2 = uVar3 | uVar4;
              goto LAB_001049a8;
            }
          }
          else {
            uVar9 = uVar3 | uVar2;
            if (uVar4 == 0) {
              *puVar8 = uVar9;
              puVar8[1] = uVar2;
              uVar10 = 2;
            }
            else {
              *puVar8 = uVar9 | uVar4;
              puVar8[1] = uVar9;
              puVar8[2] = uVar2 | uVar4;
              puVar8[3] = uVar3 | uVar4;
              uVar10 = 4;
LAB_001049a8:
              puVar8[uVar10] = uVar2;
              puVar8[uVar10 + 1] = uVar3;
              uVar10 = (ulong)((uint)uVar10 | 2);
              uVar3 = uVar4;
            }
          }
          puVar8[uVar10] = uVar3;
          puVar8[uVar10 + 1] = 0;
          __ptr->masks = puVar8;
          xcb_key_symbols_free(symbols);
          free(__ptr_00);
          pbVar7->modifiers = __ptr;
          goto LAB_00104978;
        }
      }
      free(__ptr);
      xcb_key_symbols_free(symbols);
      __ptr = __ptr_00;
    }
    free(__ptr);
  }
LAB_00104954:
  pbVar7->modifiers = (toggle_modifiers *)0x0;
  internal_logger(natwm_logger,LEVEL_WARNING,
                  "Failed to resolve toggleable modifier keys! This may cause issues");
LAB_00104978:
  pbVar7->grabbed_client = (client *)0x0;
  pbVar7->resize_helper = 0;
  return pbVar7;
}

Assistant:

struct button_state *button_state_create(xcb_connection_t *connection)
{
        struct button_state *state = malloc(sizeof(struct button_state));

        if (state == NULL) {
                return NULL;
        }

        state->modifiers = resolve_toggle_modifiers(connection);

        if (state->modifiers == NULL) {
                LOG_WARNING(natwm_logger,
                            "Failed to resolve toggleable modifier keys! This may cause issues");
        }

        state->grabbed_client = NULL;
        state->resize_helper = XCB_NONE;

        return state;
}